

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandSplitSop(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nCubesMax;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  int iVar4;
  uint local_44;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  local_44 = 0;
  Extra_UtilGetoptReset();
  nCubesMax = 100;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"Nvh"), iVar4 = globalUtilOptind, iVar1 != 0x4e) {
      if (iVar1 == -1) {
        if (pAVar2 == (Abc_Ntk_t *)0x0) {
          pcVar3 = "Empty network.\n";
        }
        else if ((pAVar2->ntkFunc == ABC_FUNC_SOP) && (pAVar2->ntkType == ABC_NTK_LOGIC)) {
          pAVar2 = Abc_NtkSplitSop(pAVar2,nCubesMax,local_44);
          if (pAVar2 != (Abc_Ntk_t *)0x0) {
            Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
            return 0;
          }
          pcVar3 = "Converting to cubes has failed.\n";
        }
        else {
          pcVar3 = "Only a SOP logic network can be transformed into cubes.\n";
        }
        iVar4 = -1;
        goto LAB_0022a3cd;
      }
      if (iVar1 != 0x76) goto LAB_0022a34d;
      local_44 = local_44 ^ 1;
    }
    if (argc <= globalUtilOptind) break;
    nCubesMax = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar4 + 1;
    if ((int)nCubesMax < 0) {
LAB_0022a34d:
      iVar4 = -2;
      Abc_Print(-2,"usage: splitsop [-N num] [-vh]\n");
      Abc_Print(-2,"\t         splits nodes whose SOP size is larger than the given one\n");
      Abc_Print(-2,"\t-N num : the maximum number of cubes after splitting [default = %d]\n",
                (ulong)nCubesMax);
      pcVar3 = "yes";
      if (local_44 == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-v     : prints verbose information [default = %s]\n",pcVar3);
      pcVar3 = "\t-h     : print the command usage\n";
LAB_0022a3cd:
      Abc_Print(iVar4,pcVar3);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
  goto LAB_0022a34d;
}

Assistant:

int Abc_CommandSplitSop( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Abc_Ntk_t * Abc_NtkSplitSop( Abc_Ntk_t * pNtk, int nCubesMax, int fVerbose );
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c, fVerbose = 0, nCubesMax = 100;
    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Nvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nCubesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCubesMax < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !Abc_NtkIsSopLogic(pNtk) )
    {
        Abc_Print( -1, "Only a SOP logic network can be transformed into cubes.\n" );
        return 1;
    }

    // get the new network
    pNtkRes = Abc_NtkSplitSop( pNtk, nCubesMax, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Converting to cubes has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: splitsop [-N num] [-vh]\n" );
    Abc_Print( -2, "\t         splits nodes whose SOP size is larger than the given one\n" );
    Abc_Print( -2, "\t-N num : the maximum number of cubes after splitting [default = %d]\n", nCubesMax );
    Abc_Print( -2, "\t-v     : prints verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}